

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImTriangulator::BuildEars(ImTriangulator *this)

{
  bool bVar1;
  int iVar2;
  int *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  ImTriangulator *in_stack_00000008;
  int i;
  ImTriangulatorNode *n1;
  undefined4 in_stack_ffffffffffffffe8;
  ImTriangulatorNode *node;
  int *piVar3;
  
  node = *(ImTriangulatorNode **)(in_RDI + 2);
  piVar3 = in_RDI;
  for (iVar2 = *in_RDI; -1 < iVar2; iVar2 = iVar2 + -1) {
    if (((float)node->Type == 0.0) &&
       (bVar1 = IsEar(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,(int)((ulong)piVar3 >> 0x20),
                      (ImVec2 *)node,(ImVec2 *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),
                      (ImVec2 *)this), bVar1)) {
      node->Type = ImTriangulatorNodeType_Ear;
      ImTriangulatorNodeSpan::push_back((ImTriangulatorNodeSpan *)(in_RDI + 4),node);
    }
    node = node->Next;
  }
  return;
}

Assistant:

void ImTriangulator::BuildEars()
{
    ImTriangulatorNode* n1 = _Nodes;
    for (int i = _TrianglesLeft; i >= 0; i--, n1 = n1->Next)
    {
        if (n1->Type != ImTriangulatorNodeType_Convex)
            continue;
        if (!IsEar(n1->Prev->Index, n1->Index, n1->Next->Index, n1->Prev->Pos, n1->Pos, n1->Next->Pos))
            continue;
        n1->Type = ImTriangulatorNodeType_Ear;
        _Ears.push_back(n1);
    }
}